

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O0

size_t __thiscall
google::protobuf::internal::ExtensionSet::Extension::MessageSetItemByteSize
          (Extension *this,int number)

{
  uint32 value;
  size_t sVar1;
  size_t sVar2;
  long local_30;
  size_t message_size;
  size_t our_size;
  int number_local;
  Extension *this_local;
  
  if ((this->type == '\v') && ((this->is_repeated & 1U) == 0)) {
    if ((this->field_0xa & 1) == 0) {
      sVar1 = io::CodedOutputStream::VarintSize32(number);
      if (((byte)this->field_0xa >> 4 & 1) == 0) {
        value = MessageLite::ByteSize((this->field_0).message_value);
      }
      else {
        value = (**(code **)((((this->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).
                             arena_ + 0x50))();
      }
      local_30 = (long)(int)value;
      sVar2 = io::CodedOutputStream::VarintSize32(value);
      this_local = (Extension *)(local_30 + sVar2 + sVar1 + 4);
    }
    else {
      this_local = (Extension *)0x0;
    }
  }
  else {
    this_local = (Extension *)ByteSize(this,number);
  }
  return (size_t)this_local;
}

Assistant:

size_t ExtensionSet::Extension::MessageSetItemByteSize(int number) const {
  if (type != WireFormatLite::TYPE_MESSAGE || is_repeated) {
    // Not a valid MessageSet extension, but compute the byte size for it the
    // normal way.
    return ByteSize(number);
  }

  if (is_cleared) return 0;

  size_t our_size = WireFormatLite::kMessageSetItemTagsSize;

  // type_id
  our_size += io::CodedOutputStream::VarintSize32(number);

  // message
  size_t message_size = 0;
  if (is_lazy) {
    message_size = lazymessage_value->ByteSize();
  } else {
    message_size = message_value->ByteSize();
  }

  our_size += io::CodedOutputStream::VarintSize32(message_size);
  our_size += message_size;

  return our_size;
}